

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.h
# Opt level: O2

void cftfsub(int n,float *a,float *w)

{
  undefined8 uVar1;
  long lVar2;
  long lVar3;
  int l;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  
  if (n < 9) {
    l = 2;
  }
  else {
    cft1st(n,a,w);
    l = 8;
    while( true ) {
      if (n <= l * 4) break;
      cftmdl(n,l,a,w);
      l = l * 4;
    }
  }
  lVar2 = (long)l;
  if (l * 4 == n) {
    for (lVar3 = 0; lVar3 < lVar2; lVar3 = lVar3 + 2) {
      fVar8 = (float)*(undefined8 *)a;
      fVar9 = (float)((ulong)*(undefined8 *)a >> 0x20);
      fVar12 = (float)*(undefined8 *)(a + lVar2);
      fVar6 = fVar8 + fVar12;
      fVar4 = (float)((ulong)*(undefined8 *)(a + lVar2) >> 0x20);
      fVar7 = fVar9 + fVar4;
      fVar8 = fVar8 - fVar12;
      fVar9 = fVar9 - fVar4;
      fVar12 = (float)*(undefined8 *)(a + lVar2 * 2);
      fVar13 = (float)((ulong)*(undefined8 *)(a + lVar2 * 2) >> 0x20);
      fVar10 = (float)*(undefined8 *)(a + lVar2 * 3);
      fVar4 = fVar12 - fVar10;
      fVar11 = (float)((ulong)*(undefined8 *)(a + lVar2 * 3) >> 0x20);
      fVar5 = fVar13 - fVar11;
      fVar12 = fVar12 + fVar10;
      fVar13 = fVar13 + fVar11;
      *(ulong *)a = CONCAT44(fVar7 + fVar13,fVar6 + fVar12);
      *(ulong *)(a + lVar2 * 2) = CONCAT44(fVar7 - fVar13,fVar6 - fVar12);
      a[lVar2] = fVar8 - fVar5;
      a[lVar2 + 1] = fVar9 + fVar4;
      a[lVar2 * 3] = fVar5 + fVar8;
      a[lVar2 * 3 + 1] = fVar9 - fVar4;
      a = a + 2;
    }
  }
  else {
    for (lVar3 = 0; lVar3 < lVar2; lVar3 = lVar3 + 2) {
      uVar1 = *(undefined8 *)(a + lVar2 + lVar3);
      fVar12 = (float)*(undefined8 *)(a + lVar3);
      fVar4 = (float)((ulong)*(undefined8 *)(a + lVar3) >> 0x20);
      fVar13 = (float)uVar1;
      a[lVar3] = fVar13 + fVar12;
      a[lVar3 + 1] = fVar4 + a[lVar2 + lVar3 + 1];
      *(ulong *)(a + lVar2 + lVar3) =
           CONCAT44(fVar4 - (float)((ulong)uVar1 >> 0x20),fVar12 - fVar13);
    }
  }
  return;
}

Assistant:

void cftfsub(int n, float *a, float *w)
{
    void cft1st(int n, float *a, float *w);
    void cftmdl(int n, int l, float *a, float *w);
    int j, j1, j2, j3, l;
    float x0r, x0i, x1r, x1i, x2r, x2i, x3r, x3i;

    l = 2;
    if (n > 8) {
        cft1st(n, a, w);
        l = 8;
        while ((l << 2) < n) {
            cftmdl(n, l, a, w);
            l <<= 2;
        }
    }
    if ((l << 2) == n) {
        for (j = 0; j < l; j += 2) {
            j1 = j + l;
            j2 = j1 + l;
            j3 = j2 + l;
            x0r = a[j] + a[j1];
            x0i = a[j + 1] + a[j1 + 1];
            x1r = a[j] - a[j1];
            x1i = a[j + 1] - a[j1 + 1];
            x2r = a[j2] + a[j3];
            x2i = a[j2 + 1] + a[j3 + 1];
            x3r = a[j2] - a[j3];
            x3i = a[j2 + 1] - a[j3 + 1];
            a[j] = x0r + x2r;
            a[j + 1] = x0i + x2i;
            a[j2] = x0r - x2r;
            a[j2 + 1] = x0i - x2i;
            a[j1] = x1r - x3i;
            a[j1 + 1] = x1i + x3r;
            a[j3] = x1r + x3i;
            a[j3 + 1] = x1i - x3r;
        }
    } else {
        for (j = 0; j < l; j += 2) {
            j1 = j + l;
            x0r = a[j] - a[j1];
            x0i = a[j + 1] - a[j1 + 1];
            a[j] += a[j1];
            a[j + 1] += a[j1 + 1];
            a[j1] = x0r;
            a[j1 + 1] = x0i;
        }
    }
}